

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_DigestFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pDigest,CK_ULONG_PTR pulDigestLen)

{
  int iVar1;
  uint uVar2;
  Session *this_00;
  HashAlgorithm *pHVar3;
  ulong __n;
  size_t sVar4;
  uchar *__src;
  ulong *in_RCX;
  Session *in_RDX;
  long in_RDI;
  ByteString digest;
  CK_ULONG size;
  Session *session;
  ByteString *in_stack_ffffffffffffff58;
  Session *in_stack_ffffffffffffff60;
  CK_SESSION_HANDLE in_stack_ffffffffffffffa0;
  HandleManager *in_stack_ffffffffffffffa8;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RCX == (ulong *)0x0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      if (iVar1 == 4) {
        pHVar3 = Session::getDigestOp(this_00);
        iVar1 = (*pHVar3->_vptr_HashAlgorithm[5])();
        __n = (ulong)iVar1;
        if (in_RDX == (Session *)0x0) {
          *in_RCX = __n;
          local_8 = 0;
        }
        else if (*in_RCX < __n) {
          *in_RCX = __n;
          local_8 = 0x150;
        }
        else {
          ByteString::ByteString((ByteString *)0x16d64e);
          pHVar3 = Session::getDigestOp(this_00);
          uVar2 = (*pHVar3->_vptr_HashAlgorithm[4])(pHVar3,&stack0xffffffffffffffa0);
          if ((uVar2 & 1) == 0) {
            Session::resetOp(in_stack_ffffffffffffff60);
            local_8 = 5;
          }
          else {
            sVar4 = ByteString::size((ByteString *)0x16d6d2);
            if (sVar4 == __n) {
              __src = ByteString::byte_str(in_stack_ffffffffffffff58);
              memcpy(in_RDX,__src,__n);
              *in_RCX = __n;
              Session::resetOp(in_RDX);
              local_8 = 0;
            }
            else {
              softHSMLog(3,"C_DigestFinal",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0xf38,"The size of the digest differ from the size of the mechanism");
              Session::resetOp(in_stack_ffffffffffffff60);
              local_8 = 5;
            }
          }
          ByteString::~ByteString((ByteString *)0x16d79b);
        }
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_DigestFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pDigest, CK_ULONG_PTR pulDigestLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulDigestLen == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Return size
	CK_ULONG size = session->getDigestOp()->getHashSize();
	if (pDigest == NULL_PTR)
	{
		*pulDigestLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulDigestLen < size)
	{
		*pulDigestLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the digest
	ByteString digest;
	if (session->getDigestOp()->hashFinal(digest) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (digest.size() != size)
	{
		ERROR_MSG("The size of the digest differ from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pDigest, digest.byte_str(), size);
	*pulDigestLen = size;

	session->resetOp();

	return CKR_OK;
}